

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QByteArray *
QtStringBuilder::
appendToByteArray<QStringBuilder<char_const(&)[6],QByteArrayView&>,char_const(&)[4]>
          (QByteArray *a,
          QStringBuilder<QStringBuilder<const_char_(&)[6],_QByteArrayView_&>,_const_char_(&)[4]> *b,
          char param_3)

{
  ArrayOptions *pAVar1;
  Data *pDVar2;
  QByteArrayView *pQVar3;
  size_t __n;
  char (*pacVar4) [4];
  char *pcVar5;
  char cVar6;
  long lVar7;
  char *__dest;
  long lVar8;
  
  pDVar2 = (a->d).d;
  lVar8 = (a->d).size;
  lVar7 = ((b->a).b)->m_size;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData((longlong)a,(AllocationOption)lVar8);
  }
  lVar8 = lVar8 + lVar7 + 8;
  pDVar2 = (a->d).d;
  if (pDVar2 == (Data *)0x0) {
    lVar7 = 0;
  }
  else {
    lVar7 = (((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) +
            (pDVar2->super_QArrayData).alloc) - (long)((a->d).ptr + (a->d).size);
  }
  if (lVar7 < lVar8) {
    if (pDVar2 == (Data *)0x0) {
      lVar7 = 0;
    }
    else {
      lVar7 = (pDVar2->super_QArrayData).alloc * 2;
    }
    if (lVar7 < lVar8) {
      lVar7 = lVar8;
    }
    if (((pDVar2 == (Data *)0x0) ||
        (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
       ((long)((((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) +
               (pDVar2->super_QArrayData).alloc) - (long)(a->d).ptr) < lVar7)) {
      lVar8 = (a->d).size;
      if (lVar7 < lVar8) {
        lVar7 = lVar8;
      }
      QByteArray::reallocData((longlong)a,(AllocationOption)lVar7);
    }
    pDVar2 = (a->d).d;
    if ((pDVar2 != (Data *)0x0) && ((pDVar2->super_QArrayData).alloc != 0)) {
      pAVar1 = &(pDVar2->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
  }
  pDVar2 = (a->d).d;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData((longlong)a,(AllocationOption)(a->d).size);
  }
  __dest = (a->d).ptr + (a->d).size;
  pcVar5 = *(b->a).a;
  cVar6 = *pcVar5;
  while (cVar6 != '\0') {
    pcVar5 = pcVar5 + 1;
    *__dest = cVar6;
    __dest = __dest + 1;
    cVar6 = *pcVar5;
  }
  pQVar3 = (b->a).b;
  __n = pQVar3->m_size;
  if (__n != 0) {
    memcpy(__dest,pQVar3->m_data,__n);
  }
  pacVar4 = b->b;
  cVar6 = (*pacVar4)[0];
  if (cVar6 != '\0') {
    lVar8 = 0;
    do {
      __dest[lVar8 + __n] = cVar6;
      cVar6 = (*pacVar4)[lVar8 + 1];
      lVar8 = lVar8 + 1;
    } while (cVar6 != '\0');
  }
  QByteArray::resize((longlong)a);
  return a;
}

Assistant:

QByteArray &appendToByteArray(QByteArray &a, const QStringBuilder<A, B> &b, char)
{
    // append 8-bit data to a byte array
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    char *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    a.resize(len); //we need to resize after the appendTo for the case str+=foo+str
    return a;
}